

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketLip.cpp
# Opt level: O0

function<void_(TcpSocket_*)> * __thiscall
TcpSocket::BindFuncBytesReceived
          (function<void_(TcpSocket_*)> *__return_storage_ptr__,TcpSocket *this,
          function<void_(TcpSocket_*)> *fBytesReceived)

{
  BaseSocketImpl *pBVar1;
  long *local_68;
  function<void_(TcpSocket_*)> local_40;
  function<void_(TcpSocket_*)> *local_20;
  function<void_(TcpSocket_*)> *fBytesReceived_local;
  TcpSocket *this_local;
  
  local_20 = fBytesReceived;
  fBytesReceived_local = (function<void_(TcpSocket_*)> *)this;
  this_local = (TcpSocket *)__return_storage_ptr__;
  pBVar1 = BaseSocket::GetImpl(&this->super_BaseSocket);
  if (pBVar1 == (BaseSocketImpl *)0x0) {
    local_68 = (long *)0x0;
  }
  else {
    local_68 = (long *)__dynamic_cast(pBVar1,&BaseSocketImpl::typeinfo,&TcpSocketImpl::typeinfo,0);
  }
  std::function<void_(TcpSocket_*)>::function(&local_40,fBytesReceived);
  (**(code **)(*local_68 + 200))(__return_storage_ptr__,local_68,&local_40);
  std::function<void_(TcpSocket_*)>::~function(&local_40);
  return __return_storage_ptr__;
}

Assistant:

std::function<void(TcpSocket*)> TcpSocket::BindFuncBytesReceived(std::function<void(TcpSocket*)> fBytesReceived)
{
    return dynamic_cast<TcpSocketImpl*>(GetImpl())->BindFuncBytesReceived(fBytesReceived);
}